

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QSsl::ImplementedClass>::relocate
          (QArrayDataPointer<QSsl::ImplementedClass> *this,qsizetype offset,ImplementedClass **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QSsl::ImplementedClass> *in_RDI;
  ImplementedClass **unaff_retaddr;
  ImplementedClass *res;
  ImplementedClass *first;
  QArrayDataPointer<QSsl::ImplementedClass> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QSsl::ImplementedClass,long_long>
            (first,(longlong)in_RDI,(ImplementedClass *)0x130b07);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QSsl::ImplementedClass>,QSsl::ImplementedClass_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 4 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }